

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_pack_hdu(fitsfile *infptr,int *outfptr,int *param_3,fitsfile *param_4,undefined8 param_5,
               undefined8 param_6,undefined8 param_7,undefined8 param_8,undefined8 param_9,
               float param_10,undefined8 param_11,float param_12)

{
  int iVar1;
  double rescale_00;
  undefined8 in_stack_00000080;
  int in_stack_00000088;
  undefined1 local_388 [8];
  imgstats imagestats;
  double noisemin;
  long datasize;
  long dataend;
  long datastart;
  long headstart;
  char fzalgor [71];
  char local_2c8 [8];
  char outfits [513];
  double rescale;
  double bscale;
  int hdunum;
  int tstatus;
  int bitpix;
  int hdutype;
  int ii;
  int naxis;
  int totpix;
  int stat;
  long naxes [9];
  fitsfile *local_38;
  fitsfile *tempfile;
  int *status_local;
  int *islossless_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  tempfile = param_4;
  status_local = param_3;
  islossless_local = outfptr;
  outfptr_local = infptr;
  memcpy(&totpix,&DAT_0010c210,0x48);
  naxis = 0;
  ii = 0;
  hdutype = 0;
  if (tempfile->HDUposition == 0) {
    ffghdt(outfptr_local,&tstatus,&naxis);
    if (tstatus == 0) {
      ffgipr(outfptr_local,9,&hdunum,&hdutype,&totpix,&naxis);
      ii = 1;
      for (bitpix = 0; bitpix < 9; bitpix = bitpix + 1) {
        ii = ii * (int)*(undefined8 *)(&totpix + (long)bitpix * 2);
      }
    }
    bscale._4_4_ = 0;
    iVar1 = ffgky(outfptr_local,0x10,"FZALGOR",&headstart,0,(long)&bscale + 4);
    if ((iVar1 == 0) &&
       ((iVar1 = strcmp((char *)&headstart,"NONE"), iVar1 == 0 ||
        (iVar1 = strcmp((char *)&headstart,"none"), iVar1 == 0)))) {
      ffcopy(outfptr_local,islossless_local,0,&naxis);
      tempfile->HDUposition = naxis;
    }
    else if ((tstatus == 2) && (in_stack_00000088 != 0)) {
      ffghad(outfptr_local,&datastart,&dataend,&datasize,tempfile);
      if (datasize - dataend < 0xb41) {
        ffcopy(outfptr_local,islossless_local,0,&naxis);
      }
      else {
        fits_compress_table(outfptr_local,islossless_local,&naxis);
      }
      tempfile->HDUposition = naxis;
    }
    else {
      iVar1 = fits_is_compressed_image(outfptr_local,&naxis);
      if ((((iVar1 == 0) && (tstatus == 0)) && (hdutype != 0)) &&
         ((ii != 0 && (in_stack_00000080._4_4_ != 0)))) {
        if (((param_10 != 0.0) || (NAN(param_10))) && ((0 < hdunum && (hdunum < 0x40)))) {
          bscale._4_4_ = 0;
          ffgky(outfptr_local,0x52,"BSCALE",&rescale,0,(long)&bscale + 4);
          if ((bscale._4_4_ == 0) && ((rescale != 1.0 || (NAN(rescale))))) {
            if (hdunum == 0x20) {
              fp_i4stat(outfptr_local,hdutype,(long *)&totpix,(imgstats *)local_388,&naxis);
            }
            else {
              fp_i2stat(outfptr_local,hdutype,(long *)&totpix,(imgstats *)local_388,&naxis);
            }
            imagestats.noise5 = imagestats.noise2;
            if (((imagestats.noise1 != 0.0) || (NAN(imagestats.noise1))) &&
               (imagestats.noise1 < imagestats.noise2)) {
              imagestats.noise5 = imagestats.noise1;
            }
            if (((imagestats.noise3 != 0.0) || (NAN(imagestats.noise3))) &&
               (imagestats.noise3 < imagestats.noise5)) {
              imagestats.noise5 = imagestats.noise3;
            }
            rescale_00 = imagestats.noise5 / (double)param_10;
            if (1.0 < rescale_00) {
              ffflnm(islossless_local,local_2c8,&naxis);
              fp_tmpnam("Tmp3",local_2c8,tempfilename3);
              ffinit(&local_38,tempfilename3,&naxis);
              ffghdn(outfptr_local,&bscale);
              if (bscale._0_4_ != 1) {
                ffcrim(local_38,8,0,&totpix,&naxis);
              }
              ffcphd(outfptr_local,local_38,&naxis);
              if (hdunum == 0x20) {
                fp_i4rescale(outfptr_local,hdutype,(long *)&totpix,rescale_00,local_38,&naxis);
              }
              else {
                fp_i2rescale(outfptr_local,hdutype,(long *)&totpix,rescale_00,local_38,&naxis);
              }
              rescale = rescale * rescale_00;
              ffuky(local_38,0x52,"BSCALE",&rescale,0,&naxis);
              ffrdef(local_38,&naxis);
              fits_img_compress(local_38,islossless_local,&naxis);
              ffdelt(local_38,&naxis);
              tempfilename3[0] = '\0';
              *status_local = 0;
              tempfile->HDUposition = naxis;
              return 0;
            }
          }
        }
        if ((0 < hdunum) && ((int)param_11 != 0)) {
          if (hdunum < 0x20) {
            fp_i2stat(outfptr_local,hdutype,(long *)&totpix,(imgstats *)local_388,&naxis);
          }
          else {
            fp_i4stat(outfptr_local,hdutype,(long *)&totpix,(imgstats *)local_388,&naxis);
          }
          ffrhdu(outfptr_local,&tstatus,&naxis);
          imagestats.noise5 = imagestats.noise2;
          if (((imagestats.noise1 != 0.0) || (NAN(imagestats.noise1))) &&
             (imagestats.noise1 < imagestats.noise2)) {
            imagestats.noise5 = imagestats.noise1;
          }
          if (((imagestats.noise3 != 0.0) || (NAN(imagestats.noise3))) &&
             (imagestats.noise3 < imagestats.noise5)) {
            imagestats.noise5 = imagestats.noise3;
          }
          if ((imagestats.noise5 < (double)(param_11._4_4_ * param_7._4_4_)) ||
             (imagestats.noise2 < (double)param_12)) {
            fits_set_lossy_int(islossless_local,0,&naxis);
            ffghdn(outfptr_local,&bscale);
            printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n"
                   ,(ulong)bscale._0_4_);
          }
          else {
            *status_local = 0;
          }
        }
        fits_img_compress(outfptr_local,islossless_local,&naxis);
        if ((hdunum < 0) ||
           (((int)param_7 == 0x29 && ((param_9._4_4_ != 0.0 || (NAN(param_9._4_4_))))))) {
          *status_local = 0;
        }
      }
      else {
        ffcopy(outfptr_local,islossless_local,0,&naxis);
      }
      tempfile->HDUposition = naxis;
    }
  }
  return 0;
}

Assistant:

int fp_pack_hdu (fitsfile *infptr, fitsfile *outfptr, fpstate fpvar,
   int *islossless, int *status)
{
	fitsfile *tempfile;
	long	naxes[9] = {1, 1, 1, 1, 1, 1, 1, 1, 1};
	int	stat=0, totpix=0, naxis=0, ii, hdutype, bitpix;
	int	tstatus, hdunum;
	double  bscale, rescale;

	char	outfits[SZ_STR], fzalgor[FLEN_VALUE];
	long 	headstart, datastart, dataend, datasize;
	double  noisemin;
	/* structure to hold image statistics (defined in fpack.h) */
	imgstats imagestats;

	if (*status) return(0);

	fits_get_hdu_type (infptr, &hdutype, &stat);

	if (hdutype == IMAGE_HDU) {
	    fits_get_img_param (infptr, 9, &bitpix, &naxis, naxes, &stat);
	    for (totpix=1, ii=0; ii < 9; ii++) totpix *= naxes[ii];
	}

	/* check directive keyword to see if this HDU should not be compressed */
        tstatus = 0;
        if (!fits_read_key(infptr, TSTRING, "FZALGOR", fzalgor, NULL, &tstatus) ) {
	    if (!strcmp(fzalgor, "NONE") || !strcmp(fzalgor, "none") ) {
 	        fits_copy_hdu (infptr, outfptr, 0, &stat);

	        *status = stat;
	        return(0);
            }
	}

        /* =============================================================== */
        /* This block is only for  binary table compression */
	if (hdutype == BINARY_TBL && fpvar.do_tables) { 

	    fits_get_hduaddr(infptr, &headstart, &datastart, &dataend, status); 
	    datasize = dataend - datastart;

	    if (datasize <= 2880) {
		/* data is less than 1 FITS block in size, so don't compress */
	        fits_copy_hdu (infptr, outfptr, 0, &stat);
	    } else {
		    fits_compress_table (infptr, outfptr, &stat);
	    }

	    *status = stat;
	    return(0);
	}
        /* =============================================================== */

        /* If this is not a non-null image HDU, just copy it verbatim */
	if (fits_is_compressed_image (infptr,  &stat) || hdutype != IMAGE_HDU ||
	    naxis == 0 || totpix == 0 || !fpvar.do_images) {
	        fits_copy_hdu (infptr, outfptr, 0, &stat);

	} else {  /* remaining code deals only with IMAGE HDUs */

		/* special case: rescale a scaled integer image to reduce noise? */
		if (fpvar.rescale_noise != 0. && bitpix > 0 && bitpix < LONGLONG_IMG) {

		   tstatus = 0;
		   fits_read_key(infptr, TDOUBLE, "BSCALE", &bscale, 0, &tstatus);
		   if (tstatus == 0 && bscale != 1.0) {  /* image must be scaled */

			if (bitpix == LONG_IMG)
			  fp_i4stat(infptr, naxis, naxes, &imagestats, &stat);
			else
			  fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);

			/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
			noisemin = imagestats.noise3;
			if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
			if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

			rescale = noisemin / fpvar.rescale_noise;
			if (rescale > 1.0) {
			  
			  /* all the criteria are met, so create a temporary file that */
			  /* contains a rescaled version of the image, in output directory */
			  
			  /* create temporary file name */
			  fits_file_name(outfptr, outfits, &stat);  /* get the output file name */
			  fp_tmpnam("Tmp3", outfits, tempfilename3);

			  fits_create_file(&tempfile, tempfilename3, &stat);

			  fits_get_hdu_num(infptr, &hdunum);
			  if (hdunum != 1) {

			     /* the input hdu is an image extension, so create dummy primary */
			     fits_create_img(tempfile, 8, 0, naxes, &stat);
			  }

			  fits_copy_header(infptr, tempfile, &stat); /* copy the header */
			  
			  /* rescale the data, so that it will compress more efficiently */
			  if (bitpix == LONG_IMG)
			    fp_i4rescale(infptr, naxis, naxes, rescale, tempfile, &stat);
			  else
			    fp_i2rescale(infptr, naxis, naxes, rescale, tempfile, &stat);


			  /* scale the BSCALE keyword by the inverse factor */

			  bscale = bscale * rescale;  
			  fits_update_key(tempfile, TDOUBLE, "BSCALE", &bscale, 0, &stat);

			  /* rescan the header, to reset the actual scaling parameters */
			  fits_set_hdustruc(tempfile, &stat);

		          fits_img_compress (tempfile, outfptr, &stat);
		          fits_delete_file  (tempfile, &stat);
		          tempfilename3[0] = '\0';   /* clear the temp filename */
		          *islossless = 0;  /* used a lossy compression method */

	                  *status = stat;
	                  return(0);
			}
		   }
		}

		/* if requested to do lossy compression of integer images (by */
		/* converting to float), then check if this HDU qualifies */
		if ( (bitpix > 0) && (fpvar.int_to_float != 0) ) {
		    
			if (bitpix >= LONG_IMG)
			  fp_i4stat(infptr, naxis, naxes, &imagestats, &stat);
			else
			  fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);

			/* rescan the image header to reset scaling values (changed by fp_iNstat) */
			ffrhdu(infptr, &hdutype, &stat);

			/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
			noisemin = imagestats.noise3;
			if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
			if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

			if ( (noisemin < (fpvar.n3ratio * fpvar.quantize_level) ) ||
			    (imagestats.noise3 < fpvar.n3min)) {
			
			    /* image contains too little noise to quantize effectively */
			    fits_set_lossy_int (outfptr, 0, &stat);

			    fits_get_hdu_num(infptr, &hdunum);

printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n", hdunum);

			} else {
			    /* compressed image is not identical to original */
			    *islossless = 0;
			}  
		}

                /* finally, do the actual image compression */
		fits_img_compress (infptr, outfptr, &stat);

		if (bitpix < 0 || 
		    (fpvar.comptype == HCOMPRESS_1 && fpvar.scale != 0.)) {

		    /* compressed image is not identical to original */
		    *islossless = 0;  
		}
	}

	*status = stat;
	return(0);
}